

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_unpg(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  
  if (in->a < 0x81) {
    uVar2 = 0;
    uVar3 = 0xff;
  }
  else {
    bVar1 = sRGB((double)in->g / (double)in->a);
    uVar3 = (uint)bVar1;
    dVar4 = floor((double)in->a / 257.0 + 0.5);
    uVar2 = (int)dVar4 & 0xff;
  }
  out->b = uVar3;
  out->g = uVar3;
  out->r = uVar3;
  out->a = uVar2;
  return;
}

Assistant:

static void
gpc_unpg(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->a <= 128)
   {
      out->r = out->g = out->b = 255;
      out->a = 0;
   }

   else
   {
      out->r = out->g = out->b = sRGB((double)in->g / in->a);
      out->a = u8d(in->a / 257.);
   }
}